

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O1

void __thiscall HACD::MyMicroAllocator::addMicroChunk(MyMicroAllocator *this)

{
  MemoryChunk *in_RCX;
  NxU8 *in_RDX;
  NxU8 *in_RSI;
  
  addMicroChunk((MyMicroAllocator *)&this[-1].mAlloc[5].mChunks.mChunks[0x1f].mChunkSize,in_RSI,
                in_RDX,in_RCX);
  return;
}

Assistant:

virtual void addMicroChunk(NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)
  {
    if ( mMicroChunkCount >= mMaxMicroChunks )
    {
        allocateMicroChunks();
    }

    bool inserted = false;
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( memEnd < mMicroChunks[i].mMemStart )
        {
            for (NxU32 j=mMicroChunkCount; j>i; j--)
            {
                mMicroChunks[j] = mMicroChunks[j-1];
            }
            mMicroChunks[i].set( memStart, memEnd, chunk );
			mLastMicroChunk = &mMicroChunks[i];
            mMicroChunkCount++;
            inserted = true;
            break;
        }
    }
    if ( !inserted )
    {
        mMicroChunks[mMicroChunkCount].set(memStart,memEnd,chunk);
		mLastMicroChunk = &mMicroChunks[mMicroChunkCount];
        mMicroChunkCount++;
    }
  }